

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complex_polymorphism.h
# Opt level: O1

void __thiscall density_tests::SingleDerivedNonPoly::check(SingleDerivedNonPoly *this)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if ((this->super_NonPolymorphicBase).m_int != 0x23) {
    detail::assert_failed<>
              ("m_int == 35",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/complex_polymorphism.h"
               ,0x18);
  }
  std::operator+(&local_30,&this->m_str1,&this->m_str2);
  iVar1 = std::__cxx11::string::compare((char *)&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  if (iVar1 != 0) {
    detail::assert_failed<>
              ("m_str1 + m_str2 == \"Hello world!!\"",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/complex_polymorphism.h"
               ,0x27);
  }
  return;
}

Assistant:

void check()
        {
            NonPolymorphicBase::check();
            DENSITY_TEST_ASSERT(m_str1 + m_str2 == "Hello world!!");
        }